

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double eval_guided_crit_weighted<float,long,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
                 long *Xc_indptr,double *buffer_arr,size_t *buffer_pos,bool as_relative_gain,
                 double *saved_xmedian,double *split_point,double *xmin,double *xmax,
                 GainCriterion criterion,double min_gain,MissingAction missing_action,
                 size_t *cols_use,size_t ncols_use,bool force_cols_use,double *X_row_major,
                 size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr,
                 vector<double,_std::allocator<double>_> *w)

{
  double dVar1;
  pointer pdVar2;
  double *pdVar3;
  ulong uVar4;
  size_t sVar5;
  ulong *puVar6;
  pointer pdVar7;
  ulong *puVar8;
  double *pdVar9;
  MissingAction missing_action_00;
  size_t *psVar10;
  long lVar11;
  ulong end_00;
  size_t row;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  allocator_type local_69;
  double local_68;
  ulong local_60;
  double local_58;
  vector<double,_std::allocator<double>_> buffer_w;
  size_t ignored;
  
  missing_action_00 = missing_action;
  psVar10 = buffer_pos;
  local_58 = min_gain;
  todense<float,long>(ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,buffer_arr);
  auVar15 = _DAT_0036b1f0;
  end_00 = end - st;
  local_68 = (double)(end_00 + 1);
  if (local_68 != 0.0) {
    uVar4 = end_00 & 0x1fffffffffffffff;
    auVar13._8_4_ = (int)uVar4;
    auVar13._0_8_ = uVar4;
    auVar13._12_4_ = (int)(uVar4 >> 0x20);
    sVar5 = 0;
    auVar13 = auVar13 ^ _DAT_0036b1f0;
    auVar18 = _DAT_0036b1e0;
    do {
      auVar17 = auVar18 ^ auVar15;
      if ((bool)(~(auVar17._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar17._0_4_ ||
                  auVar13._4_4_ < auVar17._4_4_) & 1)) {
        psVar10[sVar5] = sVar5;
      }
      if ((auVar17._12_4_ != auVar13._12_4_ || auVar17._8_4_ <= auVar13._8_4_) &&
          auVar17._12_4_ <= auVar13._12_4_) {
        psVar10[sVar5 + 1] = sVar5 + 1;
      }
      sVar5 = sVar5 + 2;
      lVar11 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar11 + 2;
    } while ((uVar4 - ((uint)end_00 & 1)) + 2 != sVar5);
  }
  if (missing_action_00 == Impute) {
    missing_action_00 = Fail;
    bVar12 = local_68 != 0.0;
    if (bVar12) {
      if ((ulong)ABS(*buffer_arr) < 0x7ff0000000000000) {
        uVar4 = 0;
        do {
          if (end_00 == uVar4) goto LAB_002b3e25;
          lVar11 = uVar4 + 1;
          uVar4 = uVar4 + 1;
        } while ((ulong)ABS(buffer_arr[lVar11]) < 0x7ff0000000000000);
        bVar12 = uVar4 < (ulong)local_68;
      }
      if (bVar12) {
        local_60 = (long)local_68 * 4 & 0xfffffffffffffff8;
        lVar11 = 0x3f;
        if (local_68 != 0.0) {
          for (; (ulong)local_68 >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        std::
        __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<eval_guided_crit_weighted<float,long,std::vector<double,std::allocator<double>>,double>(unsigned_long*,unsigned_long,unsigned_long,unsigned_long,float*,long*,long*,double*,unsigned_long*,bool,double*,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  (buffer_pos,(unsigned_long *)((long)buffer_pos + local_60),
                   buffer_pos + (long)local_68,(ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_crit_hpp:3503:30)>
                    )&buffer_arr);
        dVar1 = buffer_arr[*(long *)((long)buffer_pos + local_60)];
        *saved_xmedian = dVar1;
        if ((end_00 & 1) != 0) {
          puVar8 = buffer_pos;
          if (local_60 != 8) {
            lVar11 = local_60 - 8;
            psVar10 = buffer_pos;
            puVar6 = buffer_pos;
            do {
              puVar6 = puVar6 + 1;
              puVar8 = puVar6;
              if (*puVar6 <= *psVar10) {
                puVar8 = psVar10;
              }
              lVar11 = lVar11 + -8;
              psVar10 = puVar8;
            } while (lVar11 != 0);
          }
          auVar15._0_8_ = (double)CONCAT44(0x43300000,(int)*puVar8);
          auVar15._8_4_ = (int)(*puVar8 >> 0x20);
          auVar15._12_4_ = 0x45300000;
          dVar16 = (auVar15._8_8_ - 1.9342813113834067e+25) + (auVar15._0_8_ - 4503599627370496.0);
          *saved_xmedian = (dVar1 - dVar16) * 0.5 + dVar16;
        }
        lVar11 = (long)local_68 + (ulong)(local_68 == 0.0);
        pdVar3 = buffer_arr;
        do {
          pdVar9 = saved_xmedian;
          if ((ulong)ABS(*pdVar3) < 0x7ff0000000000000) {
            pdVar9 = pdVar3;
          }
          *pdVar3 = *pdVar9;
          auVar15 = _DAT_0036b1f0;
          pdVar3 = pdVar3 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
        missing_action_00 = Fail;
        if (local_68 != 0.0) {
          uVar4 = end_00 & 0x1fffffffffffffff;
          auVar14._8_4_ = (int)uVar4;
          auVar14._0_8_ = uVar4;
          auVar14._12_4_ = (int)(uVar4 >> 0x20);
          sVar5 = 0;
          auVar14 = auVar14 ^ _DAT_0036b1f0;
          auVar17 = _DAT_0036b1e0;
          do {
            auVar18 = auVar17 ^ auVar15;
            if ((bool)(~(auVar18._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar18._0_4_ ||
                        auVar14._4_4_ < auVar18._4_4_) & 1)) {
              buffer_pos[sVar5] = sVar5;
            }
            if ((auVar18._12_4_ != auVar14._12_4_ || auVar18._8_4_ <= auVar14._8_4_) &&
                auVar18._12_4_ <= auVar14._12_4_) {
              buffer_pos[sVar5 + 1] = sVar5 + 1;
            }
            sVar5 = sVar5 + 2;
            lVar11 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + 2;
            auVar17._8_8_ = lVar11 + 2;
            missing_action_00 = Fail;
          } while ((uVar4 - ((uint)end_00 & 1)) + 2 != sVar5);
        }
      }
      else {
LAB_002b3e25:
        missing_action_00 = Fail;
      }
    }
  }
  std::vector<double,_std::allocator<double>_>::vector(&buffer_w,(size_type)local_68,&local_69);
  if (st <= end) {
    pdVar2 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *pdVar7 = pdVar2[ix_arr[st]];
      st = st + 1;
      pdVar7 = pdVar7 + 1;
    } while (st <= end);
  }
  local_68 = eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,double>
                       (buffer_pos,0,end_00,buffer_arr,buffer_arr + (long)local_68,as_relative_gain,
                        saved_xmedian,(double *)0x0,&ignored,split_point,xmin,xmax,criterion,
                        local_58,missing_action_00,cols_use,ncols_use,force_cols_use,X_row_major,
                        ncols,Xr,Xr_ind,Xr_indptr,&buffer_w);
  if (buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_68;
}

Assistant:

double eval_guided_crit_weighted(size_t ix_arr[], size_t st, size_t end,
                                 size_t col_num, real_t_ Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                                 double buffer_arr[], size_t buffer_pos[], bool as_relative_gain,
                                 double *restrict saved_xmedian,
                                 double &restrict split_point, double &restrict xmin, double &restrict xmax,
                                 GainCriterion criterion, double min_gain, MissingAction missing_action,
                                 size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                                 double *restrict X_row_major, size_t ncols,
                                 double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                                 mapping &restrict w)
{
    size_t ignored;


    todense(ix_arr, st, end,
            col_num, Xc, Xc_ind, Xc_indptr,
            buffer_arr);
    size_t tot = end - st + 1;
    std::iota(buffer_pos, buffer_pos + tot, (size_t)0);


    if (missing_action == Impute)
    {
        missing_action = Fail;
        for (size_t ix = 0; ix < tot; ix++)
        {
            if (unlikely(is_na_or_inf(buffer_arr[ix])))
            {
                goto fill_missing;
            }
        }
        goto no_nas;

        fill_missing:
        {
            size_t idx_half = div2(tot);
            std::nth_element(buffer_pos, buffer_pos + idx_half, buffer_pos + tot,
                             [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
            *saved_xmedian = buffer_arr[buffer_pos[idx_half]];

            if ((tot % 2) == 0)
            {
                double xlow = *std::max_element(buffer_pos, buffer_pos + idx_half);
                *saved_xmedian = xlow + ((*saved_xmedian)-xlow)/2.;
            }

            for (size_t ix = 0; ix < tot; ix++)
                buffer_arr[ix] = is_na_or_inf(buffer_arr[ix])? (*saved_xmedian) : buffer_arr[ix];
            std::iota(buffer_pos, buffer_pos + tot, (size_t)0);
        }
    }


    no_nas:
    /* TODO: allocate this buffer externally */
    std::vector<double> buffer_w(tot);
    for (size_t row = st; row <= end; row++)
        buffer_w[row-st] = w[ix_arr[row]];
    /* TODO: in this case, as the weights match with the order of the indices, could use a faster version
       with a weighted rel_gain function instead (not yet implemented). */
    return eval_guided_crit_weighted<double, std::vector<double>, ldouble_safe>(
                                     buffer_pos, 0, end - st, buffer_arr, buffer_arr + tot,
                                     as_relative_gain, saved_xmedian, (double*)NULL, ignored, split_point,
                                     xmin, xmax, criterion, min_gain, missing_action,
                                     cols_use, ncols_use, force_cols_use,
                                     X_row_major, ncols,
                                     Xr, Xr_ind, Xr_indptr,
                                     buffer_w);
}